

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O2

void __thiscall adios2::format::DataManSerializer::PutAttributes(DataManSerializer *this,IO *io)

{
  mutex *__mutex;
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  int iVar4;
  AttrMap *pAVar5;
  Attribute<signed_char> *attribute;
  Attribute<char> *attribute_00;
  Attribute<std::complex<float>_> *attribute_01;
  Attribute<unsigned_char> *attribute_02;
  Attribute<std::complex<double>_> *attribute_03;
  Attribute<double> *attribute_04;
  Attribute<int> *attribute_05;
  Attribute<long> *attribute_06;
  Attribute<unsigned_long> *attribute_07;
  Attribute<short> *attribute_08;
  Attribute<unsigned_short> *attribute_09;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attribute_10;
  Attribute<unsigned_int> *attribute_11;
  Attribute<long_double> *attribute_12;
  Attribute<float> *attribute_13;
  reference pvVar6;
  undefined8 uVar7;
  __node_base *p_Var8;
  allocator local_2a2;
  allocator local_2a1;
  DataManSerializer *local_2a0;
  string local_298;
  string local_278;
  ScopedTimer __var277;
  string name;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_230;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_220;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_210;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_200;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_2a0 = this;
  if ((PutAttributes(adios2::core::IO&)::__var77 == '\0') &&
     (iVar4 = __cxa_guard_acquire(&PutAttributes(adios2::core::IO&)::__var77), iVar4 != 0)) {
    uVar7 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                ,"void adios2::format::DataManSerializer::PutAttributes(core::IO &)"
                                ,0x4d);
    PutAttributes::__var77 = (void *)ps_timer_create_(uVar7);
    __cxa_guard_release(&PutAttributes(adios2::core::IO&)::__var77);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var277,PutAttributes::__var77);
  pAVar5 = core::IO::GetAttributes_abi_cxx11_(io);
  p_Var8 = &(pAVar5->_M_h)._M_before_begin;
  bVar3 = false;
  while( true ) {
    p_Var8 = p_Var8->_M_nxt;
    if (p_Var8 == (__node_base *)0x0) break;
    std::__cxx11::string::string((string *)&name,(string *)(p_Var8 + 1));
    switch(*(undefined4 *)&p_Var8[5]._M_nxt[5]._M_nxt) {
    case 1:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_278,"/",&local_2a2);
      attribute = core::IO::InquireAttribute<signed_char>(io,&name,&local_298,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<signed_char>(local_2a0,attribute);
      break;
    case 2:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_90,"/",&local_2a2);
      attribute_08 = core::IO::InquireAttribute<short>(io,&name,&local_298,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<short>(local_2a0,attribute_08);
      break;
    case 3:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_b0,"/",&local_2a2);
      attribute_05 = core::IO::InquireAttribute<int>(io,&name,&local_298,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<int>(local_2a0,attribute_05);
      break;
    case 4:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_d0,"/",&local_2a2);
      attribute_06 = core::IO::InquireAttribute<long>(io,&name,&local_298,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<long>(local_2a0,attribute_06);
      break;
    case 5:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_f0,"/",&local_2a2);
      attribute_02 = core::IO::InquireAttribute<unsigned_char>(io,&name,&local_298,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<unsigned_char>(local_2a0,attribute_02);
      break;
    case 6:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_110,"/",&local_2a2);
      attribute_09 = core::IO::InquireAttribute<unsigned_short>(io,&name,&local_298,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<unsigned_short>(local_2a0,attribute_09);
      break;
    case 7:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_130,"/",&local_2a2);
      attribute_11 = core::IO::InquireAttribute<unsigned_int>(io,&name,&local_298,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<unsigned_int>(local_2a0,attribute_11);
      break;
    case 8:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_150,"/",&local_2a2);
      attribute_07 = core::IO::InquireAttribute<unsigned_long>(io,&name,&local_298,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<unsigned_long>(local_2a0,attribute_07);
      break;
    case 9:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_170,"/",&local_2a2);
      attribute_13 = core::IO::InquireAttribute<float>(io,&name,&local_298,&local_170);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<float>(local_2a0,attribute_13);
      break;
    case 10:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_190,"/",&local_2a2);
      attribute_04 = core::IO::InquireAttribute<double>(io,&name,&local_298,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<double>(local_2a0,attribute_04);
      break;
    case 0xb:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_1b0,"/",&local_2a2);
      attribute_12 = core::IO::InquireAttribute<long_double>(io,&name,&local_298,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<long_double>(local_2a0,attribute_12);
      break;
    case 0xc:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_1d0,"/",&local_2a2);
      attribute_01 = core::IO::InquireAttribute<std::complex<float>>(io,&name,&local_298,&local_1d0)
      ;
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<std::complex<float>>(local_2a0,attribute_01);
      break;
    case 0xd:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_1f0,"/",&local_2a2);
      attribute_03 = core::IO::InquireAttribute<std::complex<double>>
                               (io,&name,&local_298,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<std::complex<double>>(local_2a0,attribute_03);
      break;
    case 0xe:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_50,"/",&local_2a2);
      attribute_10 = core::IO::InquireAttribute<std::__cxx11::string>(io,&name,&local_298,&local_50)
      ;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<std::__cxx11::string>(local_2a0,attribute_10);
      break;
    case 0xf:
      std::__cxx11::string::string((string *)&local_298,"",&local_2a1);
      std::__cxx11::string::string((string *)&local_70,"/",&local_2a2);
      attribute_00 = core::IO::InquireAttribute<char>(io,&name,&local_298,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_298);
      PutAttribute<char>(local_2a0,attribute_00);
    }
    std::__cxx11::string::~string((string *)&name);
    bVar3 = true;
  }
  if (local_2a0->m_StaticDataFinished == false) {
    if (!bVar3) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&name,(nullptr_t)0x0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_char_(&)[13],_char[13],_0>(&local_200,(char (*) [13])"NoAttributes");
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&name,"N");
      vVar1 = pvVar6->m_type;
      pvVar6->m_type = local_200.m_type;
      jVar2 = pvVar6->m_value;
      pvVar6->m_value = local_200.m_value;
      local_200.m_type = vVar1;
      local_200.m_value = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_200);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<const_char_(&)[5],_char[5],_0>(&local_210,(char (*) [5])"bool");
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&name,"Y");
      vVar1 = pvVar6->m_type;
      pvVar6->m_type = local_210.m_type;
      jVar2 = pvVar6->m_value;
      pvVar6->m_value = local_210.m_value;
      local_210.m_type = vVar1;
      local_210.m_value = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_210);
      local_298._M_dataplus._M_p._0_1_ = 1;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<bool,_bool,_0>(&local_220,(bool *)&local_298);
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&name,"V");
      vVar1 = pvVar6->m_type;
      pvVar6->m_type = local_220.m_type;
      jVar2 = pvVar6->m_value;
      pvVar6->m_value = local_220.m_value;
      local_220.m_type = vVar1;
      local_220.m_value = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_220);
      local_298._M_dataplus._M_p._0_1_ = 1;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<bool,_bool,_0>(&local_230,(bool *)&local_298);
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&name,"G");
      vVar1 = pvVar6->m_type;
      pvVar6->m_type = local_230.m_type;
      jVar2 = pvVar6->m_value;
      pvVar6->m_value = local_230.m_value;
      local_230.m_type = vVar1;
      local_230.m_value = jVar2;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_230);
      __mutex = &local_2a0->m_StaticDataJsonMutex;
      std::mutex::lock(__mutex);
      pvVar6 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)&local_2a0->m_StaticDataJson,"S");
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::
      emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)pvVar6,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&name);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)&name);
    }
    local_2a0->m_StaticDataFinished = true;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var277);
  return;
}

Assistant:

void DataManSerializer::PutAttributes(core::IO &io)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    const auto &attributes = io.GetAttributes();
    bool attributePut = false;
    for (const auto &attributePair : attributes)
    {
        const std::string name(attributePair.first);
        const DataType type(attributePair.second->m_Type);
        if (type == DataType::None)
        {
        }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        core::Attribute<T> &attribute = *io.InquireAttribute<T>(name);                             \
        PutAttribute(attribute);                                                                   \
    }
        ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_type)
#undef declare_type
        attributePut = true;
    }

    if (!m_StaticDataFinished)
    {
        if (!attributePut)
        {
            nlohmann::json staticVar;
            staticVar["N"] = "NoAttributes";
            staticVar["Y"] = "bool";
            staticVar["V"] = true;
            staticVar["G"] = true;
            m_StaticDataJsonMutex.lock();
            m_StaticDataJson["S"].emplace_back(std::move(staticVar));
            m_StaticDataJsonMutex.unlock();
        }
        m_StaticDataFinished = true;
    }
}